

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O2

VarType * __thiscall
deqp::gles31::Functional::anon_unknown_1::RandomSSBOLayoutCase::generateType
          (VarType *__return_storage_ptr__,RandomSSBOLayoutCase *this,Random *rnd,int typeDepth,
          bool arrayOk,bool unsizedArrayOk)

{
  uint uVar1;
  int iVar2;
  DataType basicType;
  Precision precision;
  StructType *structPtr;
  ulong uVar3;
  char __rhs;
  undefined7 in_register_00000081;
  undefined8 uVar4;
  undefined7 in_register_00000089;
  long lVar5;
  bool bVar6;
  float fVar7;
  VarType elementType;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  uint local_74;
  VarType *local_70;
  vector<glu::VarType,_std::allocator<glu::VarType>_> memberTypes;
  string local_50;
  
  uVar4 = CONCAT71(in_register_00000081,arrayOk);
  if (((int)CONCAT71(in_register_00000089,unsizedArrayOk) == 0) ||
     (fVar7 = deRandom_getFloat(&rnd->m_rnd), 0.8 <= fVar7)) {
    if ((typeDepth < this->m_maxStructDepth) &&
       (fVar7 = deRandom_getFloat(&rnd->m_rnd), fVar7 < 0.1)) {
      memberTypes.super__Vector_base<glu::VarType,_std::allocator<glu::VarType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      memberTypes.super__Vector_base<glu::VarType,_std::allocator<glu::VarType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      memberTypes.super__Vector_base<glu::VarType,_std::allocator<glu::VarType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70 = __return_storage_ptr__;
      uVar1 = de::Random::getInt(rnd,1,this->m_maxStructMembers);
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      local_74 = uVar1;
      while( true ) {
        iVar2 = (int)uVar4;
        bVar6 = uVar1 == 0;
        uVar1 = uVar1 - 1;
        if (bVar6) break;
        uVar4 = 1;
        generateType(&elementType,this,rnd,typeDepth + 1,true,false);
        std::vector<glu::VarType,_std::allocator<glu::VarType>_>::emplace_back<glu::VarType>
                  (&memberTypes,&elementType);
        glu::VarType::~VarType(&elementType);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"s",&local_99);
      Functional::(anonymous_namespace)::genName_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)0x41,'Z',(char)this->m_structNdx,iVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &elementType,&local_98,&local_50);
      structPtr = bb::ShaderInterface::allocStruct
                            (&(this->super_SSBOLayoutCase).m_interface,(char *)elementType._0_8_);
      std::__cxx11::string::~string((string *)&elementType);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_98);
      this->m_structNdx = this->m_structNdx + 1;
      uVar3 = (ulong)local_74;
      __rhs = 'A';
      for (lVar5 = 0; uVar3 * 0x18 - lVar5 != 0; lVar5 = lVar5 + 0x18) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"m",(allocator<char> *)&local_50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &elementType,&local_98,__rhs);
        glu::StructType::addMember
                  (structPtr,(char *)elementType._0_8_,
                   (VarType *)
                   ((long)&(memberTypes.
                            super__Vector_base<glu::VarType,_std::allocator<glu::VarType>_>._M_impl.
                            super__Vector_impl_data._M_start)->m_type + lVar5));
        std::__cxx11::string::~string((string *)&elementType);
        std::__cxx11::string::~string((string *)&local_98);
        __rhs = __rhs + '\x01';
      }
      glu::VarType::VarType(local_70,structPtr);
      std::vector<glu::VarType,_std::allocator<glu::VarType>_>::~vector(&memberTypes);
      return local_70;
    }
    if ((!arrayOk || this->m_maxArrayLength < 1) ||
       (fVar7 = deRandom_getFloat(&rnd->m_rnd), 0.1 <= fVar7)) {
      elementType.m_data._8_8_ = 0;
      elementType.m_type = TYPE_BASIC;
      elementType._4_4_ = 0;
      elementType.m_data.array.elementType = (VarType *)0x0;
      local_98._M_dataplus._M_p._0_4_ = 1;
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                 (DataType *)&local_98);
      local_98._M_dataplus._M_p._0_4_ = 0x1b;
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                 (DataType *)&local_98);
      local_98._M_dataplus._M_p._0_4_ = 0x1f;
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                 (DataType *)&local_98);
      local_98._M_dataplus._M_p._0_4_ = 0x23;
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                 (DataType *)&local_98);
      uVar1 = this->m_features;
      if ((uVar1 & 1) != 0) {
        local_98._M_dataplus._M_p._0_4_ = 2;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 3;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 4;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0x1c;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0x1d;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0x1e;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0x20;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0x21;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0x22;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0x24;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0x25;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0x26;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        uVar1 = this->m_features;
      }
      if ((uVar1 & 2) != 0) {
        local_98._M_dataplus._M_p._0_4_ = 5;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 6;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 8;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 9;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 10;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0xb;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0xc;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
        local_98._M_dataplus._M_p._0_4_ = 0xd;
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
                   (DataType *)&local_98);
      }
      basicType = de::Random::
                  choose<glu::DataType,__gnu_cxx::__normal_iterator<glu::DataType*,std::vector<glu::DataType,std::allocator<glu::DataType>>>>
                            (rnd,(__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                                  )elementType._0_8_,
                             (__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                              )elementType.m_data.basic);
      if (basicType - TYPE_BOOL < 4) {
        precision = PRECISION_LAST;
      }
      else {
        precision = de::Random::choose<glu::Precision,glu::Precision_const*>
                              (rnd,generateType::precisionCandidates,
                               (Precision *)"Test array.length()");
      }
      glu::VarType::VarType(__return_storage_ptr__,basicType,precision);
      std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
                ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType);
      return __return_storage_ptr__;
    }
    iVar2 = de::Random::getInt(rnd,1,this->m_maxArrayLength);
    generateType(&elementType,this,rnd,typeDepth,(bool)((byte)(this->m_features >> 0xe) & 1),false);
    glu::VarType::VarType(__return_storage_ptr__,&elementType,iVar2);
  }
  else {
    generateType(&elementType,this,rnd,typeDepth,(bool)((byte)(this->m_features >> 0xe) & 1),false);
    glu::VarType::VarType(__return_storage_ptr__,&elementType,-1);
  }
  glu::VarType::~VarType(&elementType);
  return __return_storage_ptr__;
}

Assistant:

glu::VarType RandomSSBOLayoutCase::generateType (de::Random& rnd, int typeDepth, bool arrayOk, bool unsizedArrayOk)
{
	const float structWeight		= 0.1f;
	const float arrayWeight			= 0.1f;
	const float	unsizedArrayWeight	= 0.8f;

	DE_ASSERT(arrayOk || !unsizedArrayOk);

	if (unsizedArrayOk && (rnd.getFloat() < unsizedArrayWeight))
	{
		const bool			childArrayOk	= (m_features & FEATURE_ARRAYS_OF_ARRAYS) != 0;
		const glu::VarType	elementType		= generateType(rnd, typeDepth, childArrayOk, false);
		return glu::VarType(elementType, glu::VarType::UNSIZED_ARRAY);
	}
	else if (typeDepth < m_maxStructDepth && rnd.getFloat() < structWeight)
	{
		// \todo [2013-10-14 pyry] Implement unused flags for members!
//		bool					unusedOk			= (m_features & FEATURE_UNUSED_MEMBERS) != 0;
		vector<glu::VarType>	memberTypes;
		int						numMembers = rnd.getInt(1, m_maxStructMembers);

		// Generate members first so nested struct declarations are in correct order.
		for (int ndx = 0; ndx < numMembers; ndx++)
			memberTypes.push_back(generateType(rnd, typeDepth+1, true, false));

		glu::StructType& structType = m_interface.allocStruct((string("s") + genName('A', 'Z', m_structNdx)).c_str());
		m_structNdx += 1;

		DE_ASSERT(numMembers <= 'Z' - 'A');
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			structType.addMember((string("m") + (char)('A' + ndx)).c_str(), memberTypes[ndx]);
		}

		return glu::VarType(&structType);
	}
	else if (m_maxArrayLength > 0 && arrayOk && rnd.getFloat() < arrayWeight)
	{
		const int			arrayLength		= rnd.getInt(1, m_maxArrayLength);
		const bool			childArrayOk	= (m_features & FEATURE_ARRAYS_OF_ARRAYS) != 0;
		const glu::VarType	elementType		= generateType(rnd, typeDepth, childArrayOk, false);

		return glu::VarType(elementType, arrayLength);
	}
	else
	{
		vector<glu::DataType> typeCandidates;

		typeCandidates.push_back(glu::TYPE_FLOAT);
		typeCandidates.push_back(glu::TYPE_INT);
		typeCandidates.push_back(glu::TYPE_UINT);
		typeCandidates.push_back(glu::TYPE_BOOL);

		if (m_features & FEATURE_VECTORS)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC2);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC3);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC4);
			typeCandidates.push_back(glu::TYPE_INT_VEC2);
			typeCandidates.push_back(glu::TYPE_INT_VEC3);
			typeCandidates.push_back(glu::TYPE_INT_VEC4);
			typeCandidates.push_back(glu::TYPE_UINT_VEC2);
			typeCandidates.push_back(glu::TYPE_UINT_VEC3);
			typeCandidates.push_back(glu::TYPE_UINT_VEC4);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC2);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC3);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC4);
		}

		if (m_features & FEATURE_MATRICES)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X4);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4);
		}

		glu::DataType	type		= rnd.choose<glu::DataType>(typeCandidates.begin(), typeCandidates.end());
		glu::Precision	precision;

		if (!glu::isDataTypeBoolOrBVec(type))
		{
			// Precision.
			static const glu::Precision precisionCandidates[] = { glu::PRECISION_LOWP, glu::PRECISION_MEDIUMP, glu::PRECISION_HIGHP };
			precision = rnd.choose<glu::Precision>(&precisionCandidates[0], &precisionCandidates[DE_LENGTH_OF_ARRAY(precisionCandidates)]);
		}
		else
			precision = glu::PRECISION_LAST;

		return glu::VarType(type, precision);
	}
}